

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O3

QLayoutItem * __thiscall QDockAreaLayout::takeAt(QDockAreaLayout *this,int *x,int index)

{
  int iVar1;
  QLayoutItem *ret;
  QLayoutItem *pQVar2;
  long lVar3;
  
  lVar3 = 0x40;
  do {
    pQVar2 = QDockAreaLayoutInfo::takeAt
                       ((QDockAreaLayoutInfo *)((long)this->corners + lVar3),x,index);
    if (pQVar2 != (QLayoutItem *)0x0) {
      return pQVar2;
    }
    lVar3 = lVar3 + 0x70;
  } while (lVar3 != 0x200);
  pQVar2 = this->centralWidgetItem;
  if ((pQVar2 == (QLayoutItem *)0x0) || (iVar1 = *x, *x = iVar1 + 1, iVar1 != index)) {
    pQVar2 = (QLayoutItem *)0x0;
  }
  else {
    this->centralWidgetItem = (QLayoutItem *)0x0;
  }
  return pQVar2;
}

Assistant:

QLayoutItem *QDockAreaLayout::takeAt(int *x, int index)
{
    Q_ASSERT(x != nullptr);

    for (int i = 0; i < QInternal::DockCount; ++i) {
        QDockAreaLayoutInfo &dock = docks[i];
        if (QLayoutItem *ret = dock.takeAt(x, index))
            return ret;
    }

    if (centralWidgetItem && (*x)++ == index) {
        QLayoutItem *ret = centralWidgetItem;
        centralWidgetItem = nullptr;
        return ret;
    }

    return nullptr;
}